

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_signal_handler_reset(void)

{
  undefined1 local_a0 [8];
  sigaction old;
  
  if (fio_signal_set_flag == '\0') {
    fio_unlock(&fio_signal_set_flag);
    memset(local_a0,0,0x98);
    sigaction(2,(sigaction *)&fio_old_sig_int,(sigaction *)local_a0);
    sigaction(0xf,(sigaction *)&fio_old_sig_term,(sigaction *)local_a0);
    sigaction(0xd,(sigaction *)&fio_old_sig_pipe,(sigaction *)local_a0);
    if (fio_old_sig_chld.__sigaction_handler.sa_handler != (__sighandler_t)0x0) {
      sigaction(0x11,(sigaction *)&fio_old_sig_chld,(sigaction *)local_a0);
    }
    sigaction(10,(sigaction *)&fio_old_sig_usr1,(sigaction *)local_a0);
    memset(&fio_old_sig_usr1,0,0x98);
    memset(&fio_old_sig_int,0,0x98);
    memset(&fio_old_sig_term,0,0x98);
    memset(&fio_old_sig_pipe,0,0x98);
    memset(&fio_old_sig_chld,0,0x98);
  }
  return;
}

Assistant:

void fio_signal_handler_reset(void) {
  struct sigaction old;
  if (fio_signal_set_flag)
    return;
  fio_unlock(&fio_signal_set_flag);
  memset(&old, 0, sizeof(old));
  sigaction(SIGINT, &fio_old_sig_int, &old);
  sigaction(SIGTERM, &fio_old_sig_term, &old);
  sigaction(SIGPIPE, &fio_old_sig_pipe, &old);
  if (fio_old_sig_chld.sa_handler)
    sigaction(SIGCHLD, &fio_old_sig_chld, &old);
#if !FIO_DISABLE_HOT_RESTART
  sigaction(SIGUSR1, &fio_old_sig_usr1, &old);
  memset(&fio_old_sig_usr1, 0, sizeof(fio_old_sig_usr1));
#endif
  memset(&fio_old_sig_int, 0, sizeof(fio_old_sig_int));
  memset(&fio_old_sig_term, 0, sizeof(fio_old_sig_term));
  memset(&fio_old_sig_pipe, 0, sizeof(fio_old_sig_pipe));
  memset(&fio_old_sig_chld, 0, sizeof(fio_old_sig_chld));
}